

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmIntegerLiteral(LlvmCompilationContext *ctx,ExprIntegerLiteral *node)

{
  TypeBase *type;
  LLVMValueRef pLVar1;
  
  type = GetStackType(ctx,(node->super_ExprBase).type);
  CompileLlvmType(ctx,type);
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmIntegerLiteral(LlvmCompilationContext &ctx, ExprIntegerLiteral *node)
{
	return CheckType(ctx, node, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->type)), node->value, true));
}